

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestSVN.cxx
# Opt level: O0

bool __thiscall cmCTestSVN::LoadRevisions(cmCTestSVN *this)

{
  bool bVar1;
  reference svninfo_00;
  bool local_41;
  SVNInfo *svninfo;
  iterator __end1;
  iterator __begin1;
  list<cmCTestSVN::SVNInfo,_std::allocator<cmCTestSVN::SVNInfo>_> *__range1;
  bool result;
  cmCTestSVN *this_local;
  
  __range1._7_1_ = true;
  __end1 = std::__cxx11::list<cmCTestSVN::SVNInfo,_std::allocator<cmCTestSVN::SVNInfo>_>::begin
                     (&this->Repositories);
  svninfo = (SVNInfo *)
            std::__cxx11::list<cmCTestSVN::SVNInfo,_std::allocator<cmCTestSVN::SVNInfo>_>::end
                      (&this->Repositories);
  while (bVar1 = std::operator!=(&__end1,(_Self *)&svninfo), bVar1) {
    svninfo_00 = std::_List_iterator<cmCTestSVN::SVNInfo>::operator*(&__end1);
    bVar1 = LoadRevisions(this,svninfo_00);
    local_41 = false;
    if (bVar1) {
      local_41 = __range1._7_1_;
    }
    __range1._7_1_ = local_41;
    std::_List_iterator<cmCTestSVN::SVNInfo>::operator++(&__end1);
  }
  return __range1._7_1_;
}

Assistant:

bool cmCTestSVN::LoadRevisions()
{
  bool result = true;
  // Get revisions for all the external repositories
  for (SVNInfo& svninfo : this->Repositories) {
    result = this->LoadRevisions(svninfo) && result;
  }
  return result;
}